

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_SimpleString_splitNoTokenOnTheEnd_TestShell::createTest
          (TEST_SimpleString_splitNoTokenOnTheEnd_TestShell *this)

{
  TEST_SimpleString_splitNoTokenOnTheEnd_Test *this_00;
  
  this_00 = (TEST_SimpleString_splitNoTokenOnTheEnd_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                         ,0x17b);
  TEST_SimpleString_splitNoTokenOnTheEnd_Test::TEST_SimpleString_splitNoTokenOnTheEnd_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleString, splitNoTokenOnTheEnd)
{
    SimpleString string("Bah Yah oops");
    SimpleStringCollection collection;

    string.split(" ", collection);
    LONGS_EQUAL(3, collection.size());
    STRCMP_EQUAL("Bah ", collection[0].asCharString());
    STRCMP_EQUAL("Yah ", collection[1].asCharString());
    STRCMP_EQUAL("oops", collection[2].asCharString());
}